

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field_Zp.h
# Opt level: O2

int __thiscall Gudhi::persistent_cohomology::Field_Zp::init(Field_Zp *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  pointer piVar2;
  reference pvVar3;
  reference extraout_RAX;
  invalid_argument *this_01;
  int iVar4;
  int iVar5;
  int iVar6;
  int inv;
  int local_2c;
  
  iVar5 = (int)ctx;
  this->Prime = iVar5;
  if (iVar5 < 0xb502) {
    if (1 < iVar5) {
      this_00 = &this->inverse_;
      piVar2 = (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar2) {
        (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar2;
      }
      std::vector<int,_std::allocator<int>_>::reserve(this_00,(ulong)ctx & 0xffffffff);
      local_2c = 0;
      pvVar3 = std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_2c);
      iVar5 = 1;
      do {
        iVar1 = this->Prime;
        if (iVar1 <= iVar5) {
          return (int)pvVar3;
        }
        inv = 1;
        iVar4 = 0;
        iVar6 = 2;
        while( true ) {
          iVar4 = iVar4 + iVar5;
          if (iVar4 % iVar1 == 1) break;
          inv = iVar6;
          iVar6 = iVar6 + 1;
          if (iVar1 == iVar4) {
            this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_01,"homology_coeff_field must be a prime number");
            goto LAB_00117ac3;
          }
        }
        std::vector<int,_std::allocator<int>_>::push_back(this_00,&inv);
        iVar5 = iVar5 + 1;
        pvVar3 = extraout_RAX;
      } while( true );
    }
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"homology_coeff_field must be a prime number");
  }
  else {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"Maximum homology_coeff_field allowed value is 46337");
  }
LAB_00117ac3:
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void init(int charac) {
    Prime = charac;

    // Check that the provided prime is less than the maximum allowed as int, calculation below, and 'plus_times_equal' function : 46337 ; i.e (max_prime-1)*max_prime <= INT_MAX
    if(Prime > 46337)
        throw std::invalid_argument("Maximum homology_coeff_field allowed value is 46337");

    // Check for primality
    if (Prime <= 1)
        throw std::invalid_argument("homology_coeff_field must be a prime number");

    inverse_.clear();
    inverse_.reserve(charac);
    inverse_.push_back(0);
    for (int i = 1; i < Prime; ++i) {
      int inv = 1;
      int mult = inv * i;
      while ( (mult % Prime) != 1) {
        ++inv;
        if(mult == Prime)
            throw std::invalid_argument("homology_coeff_field must be a prime number");
        mult = inv * i;
      }
      inverse_.push_back(inv);
    }
  }